

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cpp
# Opt level: O3

VerySimpleReadOnlyString __thiscall
Strings::VerySimpleReadOnlyString::dropUpTo
          (VerySimpleReadOnlyString *this,VerySimpleReadOnlyString *find,bool includeFind)

{
  uint uVar1;
  uint uVar2;
  size_t sVar3;
  char in_CL;
  undefined7 in_register_00000011;
  ulong uVar4;
  ulong extraout_RDX;
  uint uVar5;
  tCharPtr __s;
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  VerySimpleReadOnlyString VVar10;
  
  uVar1 = find->length;
  __s = find->data;
  uVar2 = *(uint *)((long *)CONCAT71(in_register_00000011,includeFind) + 1);
  uVar4 = (ulong)uVar2;
  iVar7 = 0;
  uVar5 = 0;
  do {
    uVar8 = uVar5;
    if (uVar5 < uVar1) {
      uVar8 = uVar1;
    }
    uVar9 = 0;
    while( true ) {
      uVar6 = uVar1;
      if (uVar8 + iVar7 == uVar9) goto LAB_0010e8e3;
      if (*(char *)(*(long *)CONCAT71(in_register_00000011,includeFind) + (ulong)uVar9) !=
          __s[uVar5 + uVar9]) break;
      uVar9 = uVar9 + 1;
      if (uVar2 == uVar9) {
        if (uVar1 - uVar5 != 0) {
          uVar8 = 0;
          if (in_CL == '\0') {
            uVar8 = uVar2;
          }
          __s = __s + (uVar8 + uVar5);
          uVar6 = uVar1 - uVar5;
          if (in_CL == '\0') {
            uVar4 = (ulong)(uVar2 + uVar5);
            uVar6 = uVar1 - (uVar2 + uVar5);
          }
        }
LAB_0010e8e3:
        this->data = __s;
        if (uVar6 == 0xffffffff) {
          if (__s == (char *)0x0) {
            uVar6 = 0;
          }
          else {
            sVar3 = strlen(__s);
            uVar6 = (uint)sVar3;
            uVar4 = extraout_RDX;
          }
        }
        this->length = uVar6;
        VVar10._8_8_ = uVar4;
        VVar10.data = (tCharPtr)this;
        return VVar10;
      }
    }
    uVar5 = uVar5 + 1;
    iVar7 = iVar7 + -1;
  } while( true );
}

Assistant:

const VerySimpleReadOnlyString VerySimpleReadOnlyString::dropUpTo(const VerySimpleReadOnlyString & find, const bool includeFind) const
	{
	    const unsigned int pos = Find(find);
	    return VerySimpleReadOnlyString(pos == (unsigned int)length ? data : &data[includeFind ? pos : pos + (unsigned int)find.length],
	                                    pos == (unsigned int)length ? (unsigned int)length : (includeFind ? (unsigned int)length - pos
	                                                                  : (unsigned int)length - pos - (unsigned int)find.length));
	}